

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

void duckdb::RandomFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar2;
  ulong uVar3;
  double dVar4;
  optional_ptr<duckdb::FunctionLocalState,_true> local_28;
  
  local_28.ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_28);
  oVar2.ptr = local_28.ptr;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (args->count != 0) {
    pdVar1 = result->data;
    uVar3 = 0;
    do {
      dVar4 = RandomEngine::NextRandom((RandomEngine *)(oVar2.ptr + 1));
      *(double *)(pdVar1 + uVar3 * 8) = dVar4;
      uVar3 = uVar3 + 1;
    } while (uVar3 < args->count);
  }
  return;
}

Assistant:

static void RandomFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 0);
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RandomLocalState>();

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<double>(result);
	for (idx_t i = 0; i < args.size(); i++) {
		result_data[i] = lstate.random_engine.NextRandom();
	}
}